

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

ChunkHeader * __thiscall
Compressor::encodeChunk
          (ChunkHeader *__return_storage_ptr__,Compressor *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,Image *input,MaskRect bounds
          ,Point location,bool isSwitch)

{
  uint8_t uVar1;
  pointer pCVar2;
  uint8_t *puVar3;
  Impl *pIVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  iterator __begin1;
  pointer pCVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  pointer puVar7;
  pointer puVar8;
  pointer pCVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  DefaultEncode enc;
  int p2;
  int p1;
  Image sized;
  DefaultEncode local_69;
  int local_68;
  int local_64;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  MaskRect local_58;
  Image local_50;
  
  local_60 = output;
  local_58 = bounds;
  Image::resizeClampToEdge
            (&local_50,input,
             (Size)((ulong)((input->size).width + 3U & 0xfffffffc) |
                   (ulong)input->size & 0xffffffff00000000));
  out = local_60;
  pCVar5 = local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (!isSwitch) {
    for (; pCVar5 != local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
      uVar1 = pCVar5->b;
      pCVar5->b = pCVar5->r;
      pCVar5->r = uVar1;
    }
  }
  __return_storage_ptr__->type = TYPE_COLOR1;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->alignmentWords = 0;
  __return_storage_ptr__->x = 0;
  __return_storage_ptr__->y = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->x = (uint16_t)location.x;
  __return_storage_ptr__->y = (uint16_t)location.y;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = (input->size).width;
  auVar14._4_4_ = (input->size).height;
  auVar14 = pshuflw(auVar14,auVar14,0xe8);
  __return_storage_ptr__->w = (short)auVar14._0_4_;
  __return_storage_ptr__->h = (short)((uint)auVar14._0_4_ >> 0x10);
  __return_storage_ptr__->size = 0;
  pCVar5 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = (long)pCVar2 - (long)pCVar5;
  if (0 < (long)uVar11 >> 4) {
    uVar12 = uVar11 & 0xfffffffffffffff0;
    lVar10 = ((long)uVar11 >> 4) + 1;
    pCVar9 = pCVar5 + 2;
    do {
      if ((uint)pCVar9[-2] < 0xff000000) {
        pCVar9 = pCVar9 + -2;
        goto LAB_00107cdf;
      }
      if ((uint)pCVar9[-1] < 0xff000000) {
        pCVar9 = pCVar9 + -1;
        goto LAB_00107cdf;
      }
      if ((uint)*pCVar9 < 0xff000000) goto LAB_00107cdf;
      if ((uint)pCVar9[1] < 0xff000000) {
        pCVar9 = pCVar9 + 1;
        goto LAB_00107cdf;
      }
      lVar10 = lVar10 + -1;
      pCVar9 = pCVar9 + 4;
    } while (1 < lVar10);
    uVar11 = (long)pCVar2 - (long)(&pCVar5->r + uVar12);
    pCVar5 = (pointer)(&pCVar5->r + uVar12);
  }
  lVar10 = (long)uVar11 >> 2;
  if (lVar10 == 1) {
LAB_00107cc0:
    pCVar9 = pCVar5;
    if (0xfeffffff < (uint)*pCVar5) {
      pCVar9 = pCVar2;
    }
LAB_00107cdf:
    if (pCVar9 != pCVar2) {
      bVar13 = 0;
      std::vector<MaskRect,std::allocator<MaskRect>>::_M_realloc_insert<MaskRect_const&>
                ((vector<MaskRect,std::allocator<MaskRect>> *)
                 &__return_storage_ptr__->transparentMasks,(iterator)0x0,&local_58);
      goto LAB_00107d0c;
    }
  }
  else {
    if (lVar10 == 2) {
LAB_00107cb4:
      pCVar9 = pCVar5;
      if (0xfeffffff < (uint)*pCVar5) {
        pCVar5 = pCVar5 + 1;
        goto LAB_00107cc0;
      }
      goto LAB_00107cdf;
    }
    if (lVar10 == 3) {
      pCVar9 = pCVar5;
      if (0xfeffffff < (uint)*pCVar5) {
        pCVar5 = pCVar5 + 1;
        goto LAB_00107cb4;
      }
      goto LAB_00107cdf;
    }
  }
  bVar13 = 1;
  std::vector<MaskRect,std::allocator<MaskRect>>::_M_realloc_insert<MaskRect_const&>
            ((vector<MaskRect,std::allocator<MaskRect>> *)&__return_storage_ptr__->masks,
             (iterator)0x0,&local_58);
LAB_00107d0c:
  Impl::getPalettes(this->impl,&local_50,&local_64,&local_68);
  if (-1 < local_64) {
    pvVar6 = Impl::writePaletted(this->impl,&local_50,&this->impl->palette1,false);
    puVar3 = (pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_69.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&this->impl->compressor,out,puVar3,
               *(int *)&(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (int)puVar3,&local_69);
    uVar11 = (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) < uVar11) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(out,pvVar6);
    }
    else {
      __return_storage_ptr__->size = (uint32_t)uVar11;
    }
    __return_storage_ptr__->type = TYPE_INDEXED;
  }
  if ((bool)(~bVar13 & -1 < local_68)) {
    pvVar6 = Impl::writePaletted(this->impl,&local_50,&this->impl->palette2,true);
    puVar3 = (pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_69.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&this->impl->compressor,&this->impl->scratch,puVar3,
               *(int *)&(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (int)puVar3,&local_69);
    puVar7 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar4 = this->impl;
    if ((puVar7 == puVar8) ||
       ((ulong)((long)(pIVar4->scratch).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pIVar4->scratch).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (ulong)((long)puVar8 - (long)puVar7))) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(out,&pIVar4->scratch);
      puVar7 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      __return_storage_ptr__->size = (int)puVar8 - (int)puVar7;
      __return_storage_ptr__->type = TYPE_INDEXED_ALPHA;
    }
  }
  else {
    puVar7 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (puVar7 == puVar8) {
    prepareWriteRGB(&this->impl->scratch,&local_50);
    pIVar4 = this->impl;
    puVar3 = (pIVar4->scratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_69.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&pIVar4->compressor,out,puVar3,
               *(int *)&(pIVar4->scratch).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar3,&local_69);
    __return_storage_ptr__->size =
         *(int *)&(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
         *(int *)&(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    __return_storage_ptr__->type = TYPE_COLOR;
  }
  if (local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ChunkHeader Compressor::encodeChunk(std::vector<uint8_t>& output, const Image& input, MaskRect bounds, Point location, bool isSwitch) {
	Image sized = input.resizeClampToEdge(align(input.size));
	if (!isSwitch) {
		swapBR(sized);
	}
	ChunkHeader header = {};
	header.x = location.x;
	header.y = location.y;
	header.w = input.size.width;
	header.h = input.size.height;
	header.size = 0;
	bool hasTransparent = std::any_of(input.colorData.begin(), input.colorData.end(), [](Color c){ return c.a != 255; });
	if (hasTransparent) {
		header.transparentMasks.push_back(bounds);
	} else {
		header.masks.push_back(bounds);
	}
	int p1, p2;
	impl->getPalettes(sized, p1, p2);
	if (p1 >= 0) {
		auto& img = impl->writePaletted(sized, impl->palette1, false);
		compress(output, img.data(), static_cast<int>(img.size()), isSwitch);
		if (img.size() < output.size()) {
			output = img;
		} else {
			header.size = output.size();
		}
		header.type = ChunkHeader::TYPE_INDEXED;
	}
	if (p2 >= 0 && hasTransparent) {
		auto& img = impl->writePaletted(sized, impl->palette2, true);
		compress(impl->scratch, img.data(), static_cast<int>(img.size()), isSwitch);
		if (output.empty() || output.size() > impl->scratch.size()) {
			output = impl->scratch;
			header.size = output.size();
			header.type = ChunkHeader::TYPE_INDEXED_ALPHA;
		}
	}

	if (output.empty()) {
		prepareWriteRGB(impl->scratch, sized);
		compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
		header.size = output.size();
		header.type = ChunkHeader::TYPE_COLOR;
	}

	return header;
}